

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utObjImportExport.cpp
# Opt level: O3

void __thiscall
utObjImportExport_homogeneous_coordinates_Test_Test::TestBody
          (utObjImportExport_homogeneous_coordinates_Test_Test *this)

{
  aiMesh *paVar1;
  bool bVar2;
  char *pcVar3;
  AssertionResult gtest_ar_4;
  aiVector3D vertice;
  aiFace face;
  aiScene *scene;
  Importer myimporter;
  AssertHelper local_60;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  undefined8 local_48;
  float local_40 [2];
  AssertHelper local_38;
  aiFace local_30;
  aiScene *local_20;
  Importer local_18;
  
  Assimp::Importer::Importer(&local_18);
  pcVar3 = "";
  local_20 = Assimp::Importer::ReadFileFromMemory
                       (&local_18,
                        "v -0.500000 0.000000 0.400000 0.50000\nv -0.500000 0.000000 -0.800000 1.00000\nv 0.500000 1.000000 -0.800000 0.5000\nf 1 2 3\nB"
                        ,0x7b,0x400,"");
  local_58.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperNE<decltype(nullptr),aiScene_const*>
            ((internal *)&local_30,"nullptr","scene",&local_58.ptr_,&local_20);
  if ((char)local_30.mNumIndices == '\0') {
    testing::Message::Message((Message *)&local_58);
    if (local_30.mIndices != (uint *)0x0) {
      pcVar3 = *(char **)local_30.mIndices;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x156,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_58.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_58.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_58.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_30.mIndices,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_58.ptr_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_30,"scene->mNumMeshes","1U",&local_20->mNumMeshes,(uint *)&local_58)
  ;
  if ((char)local_30.mNumIndices == '\0') {
    testing::Message::Message((Message *)&local_58);
    if (local_30.mIndices == (uint *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_30.mIndices;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x158,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_58.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_58.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_58.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_30.mIndices,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  paVar1 = *local_20->mMeshes;
  local_58.ptr_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_30,"mesh->mNumVertices","3U",&paVar1->mNumVertices,(uint *)&local_58
            );
  if ((char)local_30.mNumIndices == '\0') {
    testing::Message::Message((Message *)&local_58);
    if (local_30.mIndices == (uint *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_30.mIndices;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x15a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_58.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_58.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_58.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_30.mIndices,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_58.ptr_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_30,"mesh->mNumFaces","1U",&paVar1->mNumFaces,(uint *)&local_58);
  if ((char)local_30.mNumIndices == '\0') {
    testing::Message::Message((Message *)&local_58);
    if (local_30.mIndices == (uint *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_30.mIndices;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x15b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_58.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_58.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_58.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_30.mIndices,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_30.mNumIndices = 0;
  local_30.mIndices = (uint *)0x0;
  aiFace::operator=(&local_30,paVar1->mFaces);
  local_48._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_58,"face.mNumIndices","3U",&local_30.mNumIndices,(uint *)&local_48);
  if (local_58.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x15d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_48 != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_48 != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_48 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_40[0] = paVar1->mVertices->z;
  local_48 = *(AssertHelperData **)paVar1->mVertices;
  local_60.data_._0_4_ = 0xbf800000;
  testing::internal::CmpHelperEQ<float,float>
            ((internal *)&local_58,"vertice.x","-1.0f",(float *)&local_48,(float *)&local_60);
  if (local_58.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x15f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (CONCAT44(local_60.data_._4_4_,local_60.data_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT44(local_60.data_._4_4_,local_60.data_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_60.data_._4_4_,local_60.data_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_60.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<float,float>
            ((internal *)&local_58,"vertice.y","0.0f",(float *)((long)&local_48 + 4),
             (float *)&local_60);
  if (local_58.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x160,pcVar3);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (CONCAT44(local_60.data_._4_4_,local_60.data_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT44(local_60.data_._4_4_,local_60.data_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_60.data_._4_4_,local_60.data_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_60.data_._0_4_ = 0x3f4ccccd;
  testing::internal::CmpHelperEQ<float,float>
            ((internal *)&local_58,"vertice.z","0.8f",local_40,(float *)&local_60);
  if (local_58.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x161,pcVar3);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (CONCAT44(local_60.data_._4_4_,local_60.data_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT44(local_60.data_._4_4_,local_60.data_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_60.data_._4_4_,local_60.data_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_30.mIndices != (uint *)0x0) {
    operator_delete__(local_30.mIndices);
  }
  Assimp::Importer::~Importer(&local_18);
  return;
}

Assistant:

TEST_F(utObjImportExport, homogeneous_coordinates_Test) {
    static const char *ObjModel =
        "v -0.500000 0.000000 0.400000 0.50000\n"
        "v -0.500000 0.000000 -0.800000 1.00000\n"
        "v 0.500000 1.000000 -0.800000 0.5000\n"
        "f 1 2 3\nB";

    Assimp::Importer myimporter;
    const aiScene *scene = myimporter.ReadFileFromMemory(ObjModel, strlen(ObjModel), aiProcess_ValidateDataStructure);
    EXPECT_NE(nullptr, scene);

    EXPECT_EQ(scene->mNumMeshes, 1U);
    const aiMesh *mesh = scene->mMeshes[0];
    EXPECT_EQ(mesh->mNumVertices, 3U);
    EXPECT_EQ(mesh->mNumFaces, 1U);
    const aiFace face = mesh->mFaces[0];
    EXPECT_EQ(face.mNumIndices, 3U);
    const aiVector3D vertice = mesh->mVertices[0];
    EXPECT_EQ(vertice.x, -1.0f);
    EXPECT_EQ(vertice.y, 0.0f);
    EXPECT_EQ(vertice.z, 0.8f);
}